

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall amrex::MLABecLaplacian::prepareForSolve(MLABecLaplacian *this)

{
  MLCellABecLap::prepareForSolve(&this->super_MLCellABecLap);
  applyRobinBCTermsCoeffs(this);
  averageDownCoeffs(this);
  update_singular_flags(this);
  this->m_needs_update = false;
  return;
}

Assistant:

void
MLABecLaplacian::prepareForSolve ()
{
    BL_PROFILE("MLABecLaplacian::prepareForSolve()");

    MLCellABecLap::prepareForSolve();

#if (AMREX_SPACEDIM != 3)
    applyMetricTermsCoeffs();
#endif

    applyRobinBCTermsCoeffs();

    averageDownCoeffs();

    update_singular_flags();

    m_needs_update = false;
}